

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O2

iterator * __thiscall
skiplist<DictKey,_std::less<DictKey>_>::find
          (iterator *__return_storage_ptr__,skiplist<DictKey,_std::less<DictKey>_> *this,
          DictKey *value)

{
  int iVar1;
  pointer ppSVar2;
  SLNode<DictKey> **ppSVar3;
  SLNode<DictKey> *pSVar4;
  SLNode<DictKey> *node_;
  
  ppSVar2 = (this->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->key).super__Vector_base<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppSVar2) {
    ppSVar3 = ppSVar2 + -1;
    while (node_ = *ppSVar3, node_->down != (SLNode<DictKey> *)0x0) {
      do {
        pSVar4 = node_;
        node_ = pSVar4->next;
        if (node_ == (SLNode<DictKey> *)0x0) break;
      } while ((node_->val).key_ < value->key_);
      ppSVar3 = &pSVar4->down;
    }
    do {
      node_ = node_->next;
      if (node_ == (SLNode<DictKey> *)0x0) goto LAB_00102d0a;
      iVar1 = (node_->val).key_;
    } while (iVar1 < value->key_);
    if (iVar1 == value->key_) {
      cake_iterator<false>::cake_iterator(__return_storage_ptr__,node_);
      return __return_storage_ptr__;
    }
  }
LAB_00102d0a:
  __return_storage_ptr__->node = (SLNode<DictKey> *)0x0;
  __return_storage_ptr__->node_count_ = 0;
  __return_storage_ptr__->node_count_ref_ = 0;
  __return_storage_ptr__->reverse_ = false;
  return __return_storage_ptr__;
}

Assistant:

typename skiplist<T, X>::iterator skiplist<T, X>::find(T value) {
    // Same algorithm as erase, but without erasing anything ;)
    if(key.empty())
        return end();

    // Start from top left
    SLNode<T>* follow = key.back();
    // Go on till level 0
    while(follow->down) {
        while(follow->next && compare(follow->next->val, value))
            follow = follow->next;
        follow = follow->down;
    }
    // Traverse at level 0 till dest reached
    while(follow->next && compare(follow->next->val, value))
        follow = follow->next;

    // If not exist, leave
    if(!follow->next || !_420_is_equal(follow->next->val, value, compare))
        return end();

    // This is the node for sure
    follow = follow->next;
    return iterator(follow);
}